

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppbVar3;
  cmMakefile *pcVar4;
  cmGlobalGenerator *pcVar5;
  pointer pcVar6;
  cmGeneratorTarget *pcVar7;
  cmake *pcVar8;
  cmSourceFile *this_00;
  size_t __n;
  iterator __position;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar9;
  bool bVar10;
  TargetType TVar11;
  int iVar12;
  string *psVar13;
  long lVar14;
  cmSystemTools *this_01;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  char *__s2;
  pointer ppcVar17;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_02;
  iterator iVar18;
  mapped_type *__x;
  mapped_type *this_03;
  _Base_ptr p_Var19;
  long *plVar20;
  pointer ppcVar21;
  size_type *psVar22;
  pointer *pppcVar23;
  pointer pbVar24;
  _Alloc_hider _Var25;
  pointer ppcVar26;
  pointer pbVar27;
  _Base_ptr p_Var28;
  all_files_map_t allFiles;
  string fastTarget;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_421;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_420;
  cmMakefile *local_418;
  cmGeneratorTarget **local_410;
  cmXMLWriter xml;
  string compiler;
  string make;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string local_320;
  string makeArgs;
  Tree tree;
  cmGeneratedFileStream fout;
  
  pcVar4 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
             _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar5 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var15 = (pcVar5->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_420 = lgs;
    local_418 = pcVar4;
    if ((_Rb_tree_header *)p_Var15 != &(pcVar5->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      pp_Var1 = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        compiler._M_dataplus._M_p = (pointer)0x0;
        compiler._M_string_length = 0;
        compiler.field_2._M_allocated_capacity = 0;
        for (p_Var19 = *(_Base_ptr *)(p_Var15 + 2); _Var25._M_p = compiler._M_dataplus._M_p,
            p_Var19 != p_Var15[2]._M_parent; p_Var19 = (_Base_ptr)&p_Var19->_M_parent) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&compiler,
                     compiler._M_string_length,
                     *(undefined8 *)(*(long *)(*(long *)p_Var19 + 0x28) + 0x160),
                     *(undefined8 *)(*(long *)(*(long *)p_Var19 + 0x28) + 0x168));
        }
        for (; _Var25._M_p != (pointer)compiler._M_string_length; _Var25._M_p = _Var25._M_p + 0x20)
        {
          psVar13 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
          pcVar16 = (char *)psVar13->_M_string_length;
          lVar14 = std::__cxx11::string::find(_Var25._M_p,(ulong)(psVar13->_M_dataplus)._M_p,0);
          if (lVar14 != 0) {
            this_01 = (cmSystemTools *)
                      cmLocalGenerator::GetSourceDirectory
                                ((cmLocalGenerator *)**(undefined8 **)(p_Var15 + 2));
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)&xml,this_01,*(char **)_Var25._M_p,pcVar16);
            make._M_dataplus._M_p = (pointer)0x0;
            make._M_string_length = 0;
            make.field_2._M_allocated_capacity = 0;
            cmsys::SystemTools::SplitPath
                      ((string *)&xml,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&make,false);
            allFiles._M_t._M_impl._0_8_ = pp_Var1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&allFiles,*(long *)(make._M_string_length - 0x20),
                       *(long *)(make._M_string_length - 0x18) +
                       *(long *)(make._M_string_length - 0x20));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&make,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(make._M_string_length - 0x20),(iterator)make._M_string_length);
            if ((make._M_dataplus._M_p != (pointer)make._M_string_length) &&
               (lVar14 = std::__cxx11::string::find((char *)&xml,0x55835e,0), lVar14 == -1)) {
              Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&make,1,(string *)&allFiles);
            }
            if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ != pp_Var1) {
              operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                              (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&make);
            if (xml.Output !=
                (ostream *)
                &xml.Elements.c.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete(xml.Output,
                              (ulong)((long)&((xml.Elements.c.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus)._M_p + 1));
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compiler);
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 !=
               &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap).
                _M_t._M_impl.super__Rb_tree_header);
    }
    GetCBCompilerId_abi_cxx11_(&compiler,this,local_418);
    ppbVar3 = &xml.Elements.c.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    xml.Output = (ostream *)ppbVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&xml,"CMAKE_MAKE_PROGRAM","");
    pcVar16 = cmMakefile::GetRequiredDefinition(local_418,(string *)&xml);
    std::__cxx11::string::string((string *)&make,pcVar16,(allocator *)&allFiles);
    if (xml.Output != (ostream *)ppbVar3) {
      operator_delete(xml.Output,
                      (ulong)((long)&((xml.Elements.c.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + 1));
    }
    xml.Output = (ostream *)ppbVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&xml,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS","");
    pcVar16 = cmMakefile::GetSafeDefinition(local_418,(string *)&xml);
    std::__cxx11::string::string((string *)&makeArgs,pcVar16,(allocator *)&allFiles);
    if (xml.Output != (ostream *)ppbVar3) {
      operator_delete(xml.Output,
                      (ulong)((long)&((xml.Elements.c.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + 1));
    }
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&allFiles,"CodeBlocks_project_file","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"FileVersion","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"major",(int *)&allFiles);
    allFiles._M_t._M_impl._0_4_ = 6;
    cmXMLWriter::Attribute<int>(&xml,"minor",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"Project","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    pvVar9 = local_420;
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"Option","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&allFiles,
               *(pvVar9->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                )._M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"title",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"Option","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    allFiles._M_t._M_impl._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"makefile_is_custom",(int *)&allFiles);
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"Option","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"compiler",&compiler);
    cmXMLWriter::EndElement(&xml);
    Tree::BuildVirtualFolder(&tree,&xml);
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"Build","");
    cmXMLWriter::StartElement(&xml,(string *)&allFiles);
    pvVar9 = local_420;
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    allFiles._M_t._M_impl._0_8_ = &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&allFiles,"all","");
    AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,make._M_dataplus._M_p,
                 *(pvVar9->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,compiler._M_dataplus._M_p,&makeArgs);
    if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
        &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    ppcVar21 = (pvVar9->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar21 !=
        (pvVar9->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&targets,&(*ppcVar21)->GeneratorTargets);
        for (ppcVar17 = targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppcVar17 !=
            targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppcVar17 = ppcVar17 + 1) {
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar17);
          allFiles._M_t._M_impl._0_8_ =
               &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          pcVar6 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&allFiles,pcVar6,pcVar6 + psVar13->_M_string_length);
          TVar11 = cmGeneratorTarget::GetType(*ppcVar17);
          if (TVar11 < UTILITY) {
            pcVar7 = *ppcVar17;
            AppendTarget(this,&xml,(string *)&allFiles,pcVar7,make._M_dataplus._M_p,*ppcVar21,
                         compiler._M_dataplus._M_p,&makeArgs);
            fastTarget._M_dataplus._M_p = (pointer)&fastTarget.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&fastTarget,allFiles._M_t._M_impl._0_8_,
                       CONCAT44(allFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
                       allFiles._M_t._M_impl._0_8_);
            std::__cxx11::string::append((char *)&fastTarget);
            AppendTarget(this,&xml,&fastTarget,pcVar7,make._M_dataplus._M_p,*ppcVar21,
                         compiler._M_dataplus._M_p,&makeArgs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
              operator_delete(fastTarget._M_dataplus._M_p,
                              fastTarget.field_2._M_allocated_capacity + 1);
            }
          }
          else if (TVar11 == UTILITY) {
            lVar14 = std::__cxx11::string::find((char *)&allFiles,0x56cf4f,0);
            if (((lVar14 != 0) ||
                (iVar12 = std::__cxx11::string::compare((char *)&allFiles), iVar12 == 0)) &&
               ((lVar14 = std::__cxx11::string::find((char *)&allFiles,0x56cf57,0), lVar14 != 0 ||
                (iVar12 = std::__cxx11::string::compare((char *)&allFiles), iVar12 == 0)))) {
              lVar14 = std::__cxx11::string::find((char *)&allFiles,0x585d03,0);
              if (lVar14 == 0) {
                iVar12 = std::__cxx11::string::compare((char *)&allFiles);
                goto LAB_00343371;
              }
LAB_003433d0:
              AppendTarget(this,&xml,(string *)&allFiles,(cmGeneratorTarget *)0x0,
                           make._M_dataplus._M_p,*ppcVar21,compiler._M_dataplus._M_p,&makeArgs);
            }
          }
          else if (TVar11 == GLOBAL_TARGET) {
            pcVar16 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar21);
            __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar21);
            iVar12 = strcmp(pcVar16,__s2);
LAB_00343371:
            if (iVar12 == 0) goto LAB_003433d0;
          }
          if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
              &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                            (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
        }
        if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppcVar21 = ppcVar21 + 1;
      } while (ppcVar21 !=
               (local_420->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppcVar21 = (local_420->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar21 !=
        (local_420->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar8 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
      do {
        pcVar4 = (*ppcVar21)->Makefile;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&targets_1,&(*ppcVar21)->GeneratorTargets);
        ppcVar17 = targets_1.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        while (pppcVar23 = &targets.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
              ppcVar17 !=
              targets_1.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
          local_410 = ppcVar17;
          TVar11 = cmGeneratorTarget::GetType(*ppcVar17);
          if (TVar11 < GLOBAL_TARGET) {
            sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pcVar7 = *local_410;
            targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar23;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&targets,"CMAKE_BUILD_TYPE","");
            pcVar16 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&targets);
            std::__cxx11::string::string((string *)&fastTarget,pcVar16,&local_421);
            cmGeneratorTarget::GetSourceFiles(pcVar7,&sources,&fastTarget);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
              operator_delete(fastTarget._M_dataplus._M_p,
                              fastTarget.field_2._M_allocated_capacity + 1);
            }
            if (targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar23) {
              operator_delete(targets.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)targets.
                                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            ppcVar26 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                TVar11 = cmGeneratorTarget::GetType(pcVar7);
                if (TVar11 == UTILITY) {
                  this_00 = *ppcVar26;
                  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_320,"GENERATED","");
                  bVar10 = cmSourceFile::GetPropertyAsBool(this_00,&local_320);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._M_dataplus._M_p != &local_320.field_2) {
                    operator_delete(local_320._M_dataplus._M_p,
                                    local_320.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  bVar10 = false;
                }
                if (bVar10 == false) {
                  cmSourceFile::GetLanguage_abi_cxx11_(&fastTarget,*ppcVar26);
                  iVar12 = std::__cxx11::string::compare((char *)&fastTarget);
                  if ((iVar12 == 0) ||
                     (iVar12 = std::__cxx11::string::compare((char *)&fastTarget), iVar12 == 0)) {
                    psVar13 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar26);
                    pbVar24 = (pcVar8->SourceFileExtensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pbVar27 = (pcVar8->SourceFileExtensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    bVar10 = pbVar24 != pbVar27;
                    if (bVar10) {
                      pcVar6 = (psVar13->_M_dataplus)._M_p;
                      __n = psVar13->_M_string_length;
                      do {
                        if ((__n == pbVar24->_M_string_length) &&
                           ((__n == 0 ||
                            (iVar12 = bcmp(pcVar6,(pbVar24->_M_dataplus)._M_p,__n), iVar12 == 0))))
                        break;
                        pbVar24 = pbVar24 + 1;
                        bVar10 = pbVar24 != pbVar27;
                      } while (bVar10);
                    }
                  }
                  else {
                    bVar10 = false;
                  }
                  psVar13 = cmSourceFile::GetFullPath(*ppcVar26,(string *)0x0);
                  if (bVar10) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&cFiles,psVar13);
                  }
                  this_02 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                               ::operator[](&allFiles,psVar13);
                  __position._M_current = *(cmGeneratorTarget ***)(this_02 + 8);
                  if (__position._M_current == *(cmGeneratorTarget ***)(this_02 + 0x10)) {
                    std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
                    _M_realloc_insert<cmGeneratorTarget_const*const&>(this_02,__position,local_410);
                  }
                  else {
                    *__position._M_current = *local_410;
                    *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
                    operator_delete(fastTarget._M_dataplus._M_p,
                                    fastTarget.field_2._M_allocated_capacity + 1);
                  }
                }
                ppcVar26 = ppcVar26 + 1;
              } while (ppcVar26 !=
                       sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(sources.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          ppcVar17 = local_410 + 1;
        }
        if (targets_1.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(targets_1.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)targets_1.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)targets_1.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppcVar21 = ppcVar21 + 1;
      } while (ppcVar21 !=
               (local_420->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar8 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
      pppcVar23 = &targets.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar24 = cFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&fastTarget,pbVar24);
        std::__cxx11::string::append((char *)&fastTarget);
        cmsys::SystemTools::GetFilenameWithoutExtension((string *)&targets,pbVar24);
        std::__cxx11::string::_M_append
                  ((char *)&fastTarget,
                   (ulong)targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar23) {
          operator_delete(targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        for (pbVar27 = (pcVar8->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar27 !=
            (pcVar8->HeaderFileExtensions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar27 = pbVar27 + 1) {
          targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&targets,fastTarget._M_dataplus._M_p,
                     fastTarget._M_dataplus._M_p + fastTarget._M_string_length);
          std::__cxx11::string::append((char *)&targets);
          std::__cxx11::string::_M_append((char *)&targets,(ulong)(pbVar27->_M_dataplus)._M_p);
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                   ::find(&allFiles._M_t,(string *)&targets);
          if ((_Rb_tree_header *)iVar18._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00343993:
            if (targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar23) {
              operator_delete(targets.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)targets.
                                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            break;
          }
          bVar10 = cmsys::SystemTools::FileExists
                             ((char *)targets.
                                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          if (bVar10) {
            __x = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                *)&allFiles._M_t,pbVar24);
            this_03 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&allFiles._M_t,(string *)&targets);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_03->Targets,&__x->Targets);
            goto LAB_00343993;
          }
          if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar23) {
            operator_delete(targets.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)targets.
                                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
          operator_delete(fastTarget._M_dataplus._M_p,fastTarget.field_2._M_allocated_capacity + 1);
        }
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 !=
               cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((_Rb_tree_header *)allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &allFiles._M_t._M_impl.super__Rb_tree_header) {
      paVar2 = &fastTarget.field_2;
      p_Var19 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        fastTarget._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&fastTarget,"Unit","");
        cmXMLWriter::StartElement(&xml,&fastTarget);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fastTarget._M_dataplus._M_p != paVar2) {
          operator_delete(fastTarget._M_dataplus._M_p,fastTarget.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&xml,"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var19 + 1));
        for (p_Var28 = *(_Base_ptr *)(p_Var19 + 2); p_Var28 != p_Var19[2]._M_parent;
            p_Var28 = (_Base_ptr)&p_Var28->_M_parent) {
          fastTarget._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&fastTarget,"Option","");
          cmXMLWriter::StartElement(&xml,&fastTarget);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fastTarget._M_dataplus._M_p != paVar2) {
            operator_delete(fastTarget._M_dataplus._M_p,fastTarget.field_2._M_allocated_capacity + 1
                           );
          }
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)p_Var28);
          cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"target",psVar13);
          cmXMLWriter::EndElement(&xml);
        }
        cmXMLWriter::EndElement(&xml);
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
      } while ((_Rb_tree_header *)p_Var19 != &allFiles._M_t._M_impl.super__Rb_tree_header);
    }
    pcVar16 = cmMakefile::GetHomeDirectory(local_418);
    std::__cxx11::string::string((string *)&targets,pcVar16,(allocator *)&targets_1);
    plVar20 = (long *)std::__cxx11::string::append((char *)&targets);
    psVar22 = (size_type *)(plVar20 + 2);
    if ((size_type *)*plVar20 == psVar22) {
      fastTarget.field_2._M_allocated_capacity = *psVar22;
      fastTarget.field_2._8_8_ = plVar20[3];
      fastTarget._M_dataplus._M_p = (pointer)&fastTarget.field_2;
    }
    else {
      fastTarget.field_2._M_allocated_capacity = *psVar22;
      fastTarget._M_dataplus._M_p = (pointer)*plVar20;
    }
    fastTarget._M_string_length = plVar20[1];
    *plVar20 = (long)psVar22;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    Tree::BuildUnit(&tree,&xml,&fastTarget);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fastTarget._M_dataplus._M_p != &fastTarget.field_2) {
      operator_delete(fastTarget._M_dataplus._M_p,fastTarget.field_2._M_allocated_capacity + 1);
    }
    if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)targets.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    cmXMLWriter::~cmXMLWriter(&xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeArgs._M_dataplus._M_p != &makeArgs.field_2) {
      operator_delete(makeArgs._M_dataplus._M_p,makeArgs.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)make._M_dataplus._M_p != &make.field_2) {
      operator_delete(make._M_dataplus._M_p,make.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compiler._M_dataplus._M_p != &compiler.field_2) {
      operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tree.files);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&tree.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tree.path._M_dataplus._M_p != &tree.path.field_2) {
      operator_delete(tree.path._M_dataplus._M_p,
                      CONCAT71(tree.path.field_2._M_allocated_capacity._1_7_,
                               tree.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
         it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end(); ++it) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator*>::const_iterator jt =
           it->second.begin();
         jt != it->second.end(); ++jt) {
      const std::vector<std::string>& files =
        (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
    }

    // Convert
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end(); ++jt) {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmSystemTools::GetCMakeRoot()) == 0) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it->second[0]->GetSourceDirectory(), jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end() - 1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (!splitted.empty() &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(splitted, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", CM_NULLPTR, make.c_str(), lgs[0],
                     compiler.c_str(), makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::string targetName = (*ti)->GetName();
      switch ((*ti)->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory()) == 0) {
            this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                               compiler.c_str(), makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(xml, targetName, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(xml, fastTarget, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> const& srcExts =
    this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    cmMakefile* makefile = (*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      switch ((*ti)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
               si != sources.end(); si++) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (gt->GetType() == cmStateEnums::UTILITY &&
                (*si)->GetPropertyAsBool("GENERATED")) {
              continue;
            }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX") {
              std::string const& srcext = (*si)->GetExtension();
              for (std::vector<std::string>::const_iterator ext =
                     srcExts.begin();
                   ext != srcExts.end(); ++ext) {
                if (srcext == *ext) {
                  isCFile = true;
                  break;
                }
              }
            }

            std::string const& fullPath = (*si)->GetFullPath();

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
          }
        }
        default: // intended fallthrough
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator sit = cFiles.begin();
       sit != cFiles.end(); ++sit) {
    std::string const& fileName = *sit;
    std::string headerBasename = cmSystemTools::GetFilenamePath(fileName);
    headerBasename += "/";
    headerBasename += cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for (std::vector<std::string>::const_iterator ext = headerExts.begin();
         ext != headerExts.end(); ++ext) {
      std::string hname = headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname.c_str())) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator sit = allFiles.begin();
       sit != allFiles.end(); ++sit) {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (std::vector<const cmGeneratorTarget*>::const_iterator ti =
           unit.Targets.begin();
         ti != unit.Targets.end(); ++ti) {
      xml.StartElement("Option");
      xml.Attribute("target", (*ti)->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, std::string(mf->GetHomeDirectory()) + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}